

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SVM.pb.cc
# Opt level: O0

void __thiscall
CoreML::Specification::Kernel::SerializeWithCachedSizes(Kernel *this,CodedOutputStream *output)

{
  bool bVar1;
  uint32 cached_has_bits;
  CodedOutputStream *output_local;
  Kernel *this_local;
  
  bVar1 = has_linearkernel(this);
  if (bVar1) {
    google::protobuf::internal::WireFormatLite::WriteMessage
              (1,&((this->kernel_).linearkernel_)->super_MessageLite,output);
  }
  bVar1 = has_rbfkernel(this);
  if (bVar1) {
    google::protobuf::internal::WireFormatLite::WriteMessage
              (2,&((this->kernel_).linearkernel_)->super_MessageLite,output);
  }
  bVar1 = has_polykernel(this);
  if (bVar1) {
    google::protobuf::internal::WireFormatLite::WriteMessage
              (3,&((this->kernel_).linearkernel_)->super_MessageLite,output);
  }
  bVar1 = has_sigmoidkernel(this);
  if (bVar1) {
    google::protobuf::internal::WireFormatLite::WriteMessage
              (4,&((this->kernel_).linearkernel_)->super_MessageLite,output);
  }
  return;
}

Assistant:

void Kernel::SerializeWithCachedSizes(
    ::google::protobuf::io::CodedOutputStream* output) const {
  // @@protoc_insertion_point(serialize_start:CoreML.Specification.Kernel)
  ::google::protobuf::uint32 cached_has_bits = 0;
  (void) cached_has_bits;

  // .CoreML.Specification.LinearKernel linearKernel = 1;
  if (has_linearkernel()) {
    ::google::protobuf::internal::WireFormatLite::WriteMessage(
      1, *kernel_.linearkernel_, output);
  }

  // .CoreML.Specification.RBFKernel rbfKernel = 2;
  if (has_rbfkernel()) {
    ::google::protobuf::internal::WireFormatLite::WriteMessage(
      2, *kernel_.rbfkernel_, output);
  }

  // .CoreML.Specification.PolyKernel polyKernel = 3;
  if (has_polykernel()) {
    ::google::protobuf::internal::WireFormatLite::WriteMessage(
      3, *kernel_.polykernel_, output);
  }

  // .CoreML.Specification.SigmoidKernel sigmoidKernel = 4;
  if (has_sigmoidkernel()) {
    ::google::protobuf::internal::WireFormatLite::WriteMessage(
      4, *kernel_.sigmoidkernel_, output);
  }

  // @@protoc_insertion_point(serialize_end:CoreML.Specification.Kernel)
}